

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_close_self_no_reason(void)

{
  cio_error cVar1;
  uint16_t data;
  ws_frame frames [1];
  undefined2 local_2a;
  ws_frame local_28;
  
  local_28.data = &local_2a;
  local_2a = 1000;
  local_28.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
  local_28.direction = FROM_CLIENT;
  local_28.data_length = 2;
  local_28.last_frame = true;
  local_28.rsv = false;
  serialize_frames(&local_28,1);
  cVar1 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,close_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,"Closing did not succeed!",0x81c,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x81f,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x821,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x822,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context of read handler not NULL",0x823);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
             0x824,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x826,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_control_fake.call_count,
             "control callback was not called for last close frame",0x828,UNITY_DISPLAY_STYLE_INT);
  if (on_control_fake.arg0_val != (cio_websocket *)0x0) {
    UnityAssertEqualNumber
              (8,(ulong)on_control_fake.arg1_val,"websocket parameter of control callback is NULL",
               0x82a,UNITY_DISPLAY_STYLE_INT);
    if (on_control_fake.arg2_val != (uint8_t *)0x0) {
      UnityAssertEqualNumber
                (2,(ulong)on_control_fake.arg3_val,
                 "data length parameter of control callback is not correct",0x82c,
                 UNITY_DISPLAY_STYLE_INT);
      return;
    }
    UnityFail("data parameter of control callback is not correct",0x82b);
  }
  UnityFail("websocket parameter of control callback is NULL",0x829);
}

Assistant:

static void test_close_self_no_reason(void)
{
	uint16_t data = CIO_WEBSOCKET_CLOSE_NORMAL;

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = &data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, close_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Closing did not succeed!");

	err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was not called for last close frame");
	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_val, "websocket parameter of control callback is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "websocket parameter of control callback is NULL");
	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg2_val, "data parameter of control callback is not correct");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), on_control_fake.arg3_val, "data length parameter of control callback is not correct");
}